

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::strings_internal::BigUnsigned<4>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BigUnsigned<4> *this)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  BigUnsigned<4> copy;
  BigUnsigned<4> local_38;
  
  local_38.words_[3] = this->words_[3];
  local_38.size_ = this->size_;
  local_38.words_[0] = this->words_[0];
  local_38.words_._4_8_ = *(undefined8 *)(this->words_ + 1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    if (local_38.size_ < 1) break;
    DivMod<10u>(&local_38);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar4 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar4 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar3 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar4;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + -1;
      pcVar2 = pcVar3;
    } while (pcVar3 < pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BigUnsigned<max_words>::ToString() const {
  BigUnsigned<max_words> copy = *this;
  std::string result;
  // Build result in reverse order
  while (copy.size() > 0) {
    uint32_t next_digit = copy.DivMod<10>();
    result.push_back('0' + static_cast<char>(next_digit));
  }
  if (result.empty()) {
    result.push_back('0');
  }
  std::reverse(result.begin(), result.end());
  return result;
}